

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

void Abc_NtkPrecomputeCellPairsTest(void)

{
  uint uVar1;
  Mio_Cell2_t *pCells;
  Vec_Int_t *vInfo;
  Vec_Int_t *p;
  int nCells;
  
  pCells = Mio_CollectRootsNewDefault2(6,&nCells,0);
  vInfo = Abc_NtkPrecomputeCellPairs(pCells,nCells);
  uVar1 = Abc_NtkPrecomputePrint(pCells,nCells,vInfo);
  p = Abc_NtkPrecomputeFirsts(pCells,nCells);
  printf("Used records = %d.  All records = %d.\n",(ulong)uVar1,(ulong)(vInfo->nSize / 3 - uVar1));
  if (nCells == p->nSize) {
    Vec_IntFree(p);
    Vec_IntFree(vInfo);
    free(pCells);
    return;
  }
  __assert_fail("nCells == Vec_IntSize(vFirst)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                ,0xac,"void Abc_NtkPrecomputeCellPairsTest()");
}

Assistant:

void Abc_NtkPrecomputeCellPairsTest()
{
    int nCells;
    Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
    Vec_Int_t * vInfo = Abc_NtkPrecomputeCellPairs( pCells, nCells );
    int nRecUsed = Abc_NtkPrecomputePrint( pCells, nCells, vInfo );
    // iterate through the cells
    Vec_Int_t * vFirst = Abc_NtkPrecomputeFirsts( pCells, nCells );
    printf( "Used records = %d.  All records = %d.\n", nRecUsed, Vec_IntSize(vInfo)/3 - nRecUsed );
    assert( nCells == Vec_IntSize(vFirst) );
    Vec_IntFree( vFirst );
    Vec_IntFree( vInfo );
    ABC_FREE( pCells );
}